

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiffdec.c
# Opt level: O0

int ExtractMetadataFromTIFF(TIFF *tif,Metadata *metadata)

{
  int iVar1;
  undefined8 in_RDI;
  uint32_t tag_data_len;
  void *tag_data;
  MetadataPayload *payload;
  toff_t exif_ifd_offset;
  int i;
  MetadataPayload *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  undefined1 local_28 [12];
  int local_1c;
  undefined8 local_10;
  
  local_1c = 0;
  local_10 = in_RDI;
  while( true ) {
    if (kTIFFMetadataMap[local_1c].tag == 0) {
      iVar1 = TIFFGetField(local_10,0x8769,local_28);
      if (iVar1 != 0) {
        fprintf(_stderr,"Warning: EXIF extraction from TIFF is unsupported.\n");
      }
      return 1;
    }
    iVar1 = TIFFGetField(local_10,kTIFFMetadataMap[local_1c].tag,&stack0xffffffffffffffc4,
                         &stack0xffffffffffffffc8);
    if ((iVar1 != 0) &&
       (iVar1 = MetadataCopy(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                             in_stack_ffffffffffffffb8), iVar1 == 0)) break;
    local_1c = local_1c + 1;
  }
  return 0;
}

Assistant:

static int ExtractMetadataFromTIFF(TIFF* const tif, Metadata* const metadata) {
  int i;
  toff_t exif_ifd_offset;

  for (i = 0; kTIFFMetadataMap[i].tag != 0; ++i) {
    MetadataPayload* const payload =
        (MetadataPayload*)((uint8_t*)metadata +
                           kTIFFMetadataMap[i].storage_offset);
    void* tag_data;
    uint32_t tag_data_len;

    if (TIFFGetField(tif, kTIFFMetadataMap[i].tag, &tag_data_len, &tag_data) &&
        !MetadataCopy((const char*)tag_data, tag_data_len, payload)) {
      return 0;
    }
  }

  // TODO(jzern): To extract the raw EXIF directory some parsing of it would be
  // necessary to determine the overall size. In addition, value offsets in
  // individual directory entries may need to be updated as, depending on the
  // type, they are file based.
  // Exif 2.2 Section 4.6.2 Tag Structure
  // TIFF Revision 6.0 Part 1 Section 2 TIFF Structure #Image File Directory
  if (TIFFGetField(tif, TIFFTAG_EXIFIFD, &exif_ifd_offset)) {
    fprintf(stderr, "Warning: EXIF extraction from TIFF is unsupported.\n");
  }
  return 1;
}